

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::TestInfo::~TestInfo(TestInfo *this)

{
  string *in_RDI;
  TestResult *this_00;
  
  this_00 = *(TestResult **)(in_RDI + 0x60);
  if (this_00 != (TestResult *)0x0) {
    (**(code **)((this_00->test_properites_mutex_).super_MutexBase.mutex_.__align + 8))();
  }
  TestResult::~TestResult(this_00);
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x2fb086);
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x2fb093);
  std::__cxx11::string::~string(in_RDI + 0x20);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

TestInfo::~TestInfo() { delete factory_; }